

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O2

CURLcode Curl_add_handle_to_pipeline(SessionHandle *handle,connectdata *conn)

{
  curl_llist *pipeline;
  curl_llist_element *pcVar1;
  curl_llist_element *pcVar2;
  CURLcode CVar3;
  
  pipeline = conn->send_pipe;
  pcVar1 = pipeline->head;
  CVar3 = Curl_addHandleToPipeline(handle,pipeline);
  if ((pipeline == conn->send_pipe) && (pcVar2 = conn->send_pipe->head, pcVar1 != pcVar2)) {
    conn->writechannel_inuse = false;
    Curl_expire((SessionHandle *)pcVar2->ptr,1);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_add_handle_to_pipeline(struct SessionHandle *handle,
                                     struct connectdata *conn)
{
  struct curl_llist_element *sendhead = conn->send_pipe->head;
  struct curl_llist *pipeline;
  CURLcode rc;

  pipeline = conn->send_pipe;

  rc = Curl_addHandleToPipeline(handle, pipeline);

  if(pipeline == conn->send_pipe && sendhead != conn->send_pipe->head) {
    /* this is a new one as head, expire it */
    conn->writechannel_inuse = FALSE; /* not in use yet */
    Curl_expire(conn->send_pipe->head->ptr, 1);
  }

#if 0 /* enable for pipeline debugging */
  print_pipeline(conn);
#endif

  return rc;
}